

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fIndexedStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::anon_unknown_0::UniformBufferBindingCase::testUniformBuffers
          (UniformBufferBindingCase *this)

{
  GLuint index;
  TestContext *testCtx;
  bool bVar1;
  int *piVar2;
  undefined1 local_4c [8];
  StateQueryMemoryWriteGuard<int> boundBuffer;
  int ndx_1;
  int ndx;
  GLuint buffers [2];
  GLuint uniformIndices [2];
  char *uniformNames [2];
  UniformBufferBindingCase *this_local;
  
  uniformIndices = (GLuint  [2])anon_var_dwarf_4419a9;
  memset(buffers,0,8);
  glu::CallLogWrapper::glGetUniformIndices
            (&(this->super_UniformBufferCase).super_ApiCase.super_CallLogWrapper,
             (this->super_UniformBufferCase).m_program,2,(GLchar **)uniformIndices,buffers);
  glu::CallLogWrapper::glGenBuffers
            (&(this->super_UniformBufferCase).super_ApiCase.super_CallLogWrapper,2,(GLuint *)&ndx_1)
  ;
  for (boundBuffer.m_postguard = 0; boundBuffer.m_postguard < 2;
      boundBuffer.m_postguard = boundBuffer.m_postguard + 1) {
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_UniformBufferCase).super_ApiCase.super_CallLogWrapper,0x8a11,
               (&ndx_1)[boundBuffer.m_postguard]);
    glu::CallLogWrapper::glBufferData
              (&(this->super_UniformBufferCase).super_ApiCase.super_CallLogWrapper,0x8a11,0x20,
               (void *)0x0,0x88e8);
    glu::CallLogWrapper::glBindBufferBase
              (&(this->super_UniformBufferCase).super_ApiCase.super_CallLogWrapper,0x8a11,
               buffers[boundBuffer.m_postguard],(&ndx_1)[boundBuffer.m_postguard]);
    ApiCase::expectError((ApiCase *)this,0);
  }
  for (boundBuffer.m_value = 0; boundBuffer.m_value < 2;
      boundBuffer.m_value = boundBuffer.m_value + 1) {
    deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard
              ((StateQueryMemoryWriteGuard<int> *)local_4c);
    index = buffers[boundBuffer.m_value];
    piVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::operator&
                       ((StateQueryMemoryWriteGuard<int> *)local_4c);
    glu::CallLogWrapper::glGetIntegeri_v
              (&(this->super_UniformBufferCase).super_ApiCase.super_CallLogWrapper,0x8a28,index,
               piVar2);
    bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
                      ((StateQueryMemoryWriteGuard<int> *)local_4c,
                       (this->super_UniformBufferCase).super_ApiCase.super_TestCase.super_TestCase.
                       super_TestNode.m_testCtx);
    if (bVar1) {
      testCtx = (this->super_UniformBufferCase).super_ApiCase.super_TestCase.super_TestCase.
                super_TestNode.m_testCtx;
      piVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_int_
                         ((StateQueryMemoryWriteGuard *)local_4c);
      checkIntEquals(testCtx,*piVar2,(&ndx_1)[boundBuffer.m_value]);
    }
    ApiCase::expectError((ApiCase *)this,0);
  }
  glu::CallLogWrapper::glDeleteBuffers
            (&(this->super_UniformBufferCase).super_ApiCase.super_CallLogWrapper,2,(GLuint *)&ndx_1)
  ;
  return;
}

Assistant:

void testUniformBuffers (void)
	{
		const char* uniformNames[] =
		{
			"input1",
			"input2"
		};
		GLuint uniformIndices[2] = {0};
		glGetUniformIndices(m_program, 2, uniformNames, uniformIndices);

		GLuint buffers[2];
		glGenBuffers(2, buffers);

		for (int ndx = 0; ndx < 2; ++ndx)
		{
			glBindBuffer(GL_UNIFORM_BUFFER, buffers[ndx]);
			glBufferData(GL_UNIFORM_BUFFER, 32, DE_NULL, GL_DYNAMIC_DRAW);
			glBindBufferBase(GL_UNIFORM_BUFFER, uniformIndices[ndx], buffers[ndx]);
			expectError(GL_NO_ERROR);
		}

		for (int ndx = 0; ndx < 2; ++ndx)
		{
			StateQueryMemoryWriteGuard<GLint> boundBuffer;
			glGetIntegeri_v(GL_UNIFORM_BUFFER_BINDING, uniformIndices[ndx], &boundBuffer);

			if (boundBuffer.verifyValidity(m_testCtx))
				checkIntEquals(m_testCtx, boundBuffer, buffers[ndx]);
			expectError(GL_NO_ERROR);
		}

		glDeleteBuffers(2, buffers);
	}